

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O0

Sexp * AnalyzeLet(Sexp *form)

{
  pointer *pppSVar1;
  InvocationMeaning *base;
  pointer ppSVar2;
  bool bVar3;
  JetRuntimeException *pJVar4;
  Sexp *pSVar5;
  reference ppSVar6;
  SequenceMeaning *this;
  vector<Sexp_*,_std::allocator<Sexp_*>_> *pvVar7;
  Sexp **ppSVar8;
  LambdaMeaning *this_00;
  size_type arity;
  InvocationMeaning *this_01;
  vector<Sexp_*,_std::allocator<Sexp_*>_> local_200;
  InvocationMeaning *local_1e8;
  InvocationMeaning *call_meaning;
  Sexp *lambda_meaning;
  LambdaMeaning *base_value;
  Sexp *body_meaning;
  vector<Sexp_*,_std::allocator<Sexp_*>_> local_1c0;
  SequenceMeaning *local_1a8;
  SequenceMeaning *body_meaning_value;
  Sexp *last;
  function<void_(Sexp_*)> local_190;
  anon_class_8_1_717490bf local_170;
  function<void_(Sexp_*)> local_168;
  anon_class_8_1_10ae0417 local_148;
  function<void_(Sexp_*)> local_140;
  undefined1 local_11a;
  allocator local_119;
  string local_118 [38];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  tuple<bool&,unsigned_long&> local_a8 [16];
  undefined1 local_98 [31];
  bool is_proper;
  size_t len;
  vector<Sexp_*,_std::allocator<Sexp_*>_> body_values;
  vector<Sexp_*,_std::allocator<Sexp_*>_> binding_values;
  vector<Sexp_*,_std::allocator<Sexp_*>_> variables;
  Sexp *bindings;
  FrameProtector local_18;
  FrameProtector __frame_prot;
  Sexp *form_local;
  
  __frame_prot.protected_frame = (Frame *)form;
  FrameProtector::FrameProtector(&local_18,"AnalyzeLet");
  FrameProtector::ProtectValue(&local_18,(Sexp **)&__frame_prot,"form");
  variables.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  FrameProtector::ProtectValue
            (&local_18,
             (Sexp **)&variables.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,"bindings");
  pppSVar1 = &binding_values.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)pppSVar1);
  FrameProtector::ProtectVector
            (&local_18,(vector<Sexp_*,_std::allocator<Sexp_*>_> *)pppSVar1,"variables");
  pppSVar1 = &body_values.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)pppSVar1);
  FrameProtector::ProtectVector
            (&local_18,(vector<Sexp_*,_std::allocator<Sexp_*>_> *)pppSVar1,"binding_values");
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)&len);
  FrameProtector::ProtectVector
            (&local_18,(vector<Sexp_*,_std::allocator<Sexp_*>_> *)&len,"body_values");
  Sexp::Length((Sexp *)local_98);
  std::tie<bool,unsigned_long>((bool *)local_a8,(unsigned_long *)(local_98 + 0x17));
  std::tuple<bool&,unsigned_long&>::operator=(local_a8,(tuple<bool,_unsigned_long> *)local_98);
  if ((local_98[0x17] & 1) == 0) {
    local_ca = 1;
    pJVar4 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"invalid let form",&local_c9);
    JetRuntimeException::JetRuntimeException(pJVar4,(string *)local_c8);
    local_ca = 0;
    __cxa_throw(pJVar4,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  pSVar5 = Sexp::Car((Sexp *)__frame_prot.protected_frame);
  bVar3 = Sexp::IsCons(pSVar5);
  if (!bVar3) {
    local_f2 = 1;
    pJVar4 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"invalid let form: bad binding list",&local_f1);
    JetRuntimeException::JetRuntimeException(pJVar4,(string *)local_f0);
    local_f2 = 0;
    __cxa_throw(pJVar4,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  variables.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Sexp::Car((Sexp *)__frame_prot.protected_frame);
  bVar3 = Sexp::IsProperList((Sexp *)variables.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar3) {
    local_11a = 1;
    pJVar4 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"invalid let form: bad binding list",&local_119);
    JetRuntimeException::JetRuntimeException(pJVar4,(string *)local_118);
    local_11a = 0;
    __cxa_throw(pJVar4,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  Environment::EnterScope(g_the_environment);
  ppSVar2 = variables.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  local_148.variables =
       (vector<Sexp_*,_std::allocator<Sexp_*>_> *)
       &binding_values.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::function<void(Sexp*)>::function<AnalyzeLet(Sexp*)::__0,void>
            ((function<void(Sexp*)> *)&local_140,&local_148);
  Sexp::ForEach((Sexp *)ppSVar2,&local_140);
  std::function<void_(Sexp_*)>::~function(&local_140);
  pSVar5 = Sexp::Cdr((Sexp *)__frame_prot.protected_frame);
  bVar3 = Sexp::IsCons(pSVar5);
  if (!bVar3) {
    __assert_fail("form->Cdr()->IsCons()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/analysis.cpp"
                  ,0x233,"Sexp *AnalyzeLet(Sexp *)");
  }
  pSVar5 = Sexp::Cdr((Sexp *)__frame_prot.protected_frame);
  local_170.body_values = (vector<Sexp_*,_std::allocator<Sexp_*>_> *)&len;
  std::function<void(Sexp*)>::function<AnalyzeLet(Sexp*)::__1,void>
            ((function<void(Sexp*)> *)&local_168,&local_170);
  Sexp::ForEach(pSVar5,&local_168);
  std::function<void_(Sexp_*)>::~function(&local_168);
  Environment::ExitScope(g_the_environment);
  ppSVar2 = variables.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  last = (Sexp *)&body_values.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
  std::function<void(Sexp*)>::function<AnalyzeLet(Sexp*)::__2,void>
            ((function<void(Sexp*)> *)&local_190,(anon_class_8_1_14b1de5a *)&last);
  Sexp::ForEach((Sexp *)ppSVar2,&local_190);
  std::function<void_(Sexp_*)>::~function(&local_190);
  body_meaning_value = (SequenceMeaning *)0x0;
  FrameProtector::ProtectValue(&local_18,(Sexp **)&body_meaning_value,"last");
  ppSVar6 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::back
                      ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)&len);
  body_meaning_value = (SequenceMeaning *)*ppSVar6;
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::pop_back
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)&len);
  this = (SequenceMeaning *)operator_new(0x28);
  body_meaning._7_1_ = 1;
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
            (&local_1c0,(vector<Sexp_*,_std::allocator<Sexp_*>_> *)&len);
  SequenceMeaning::SequenceMeaning(this,&local_1c0,(Sexp *)body_meaning_value);
  body_meaning._7_1_ = 0;
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::~vector(&local_1c0);
  local_1a8 = this;
  pvVar7 = SequenceMeaning::Body(this);
  FrameProtector::ProtectVector(&local_18,pvVar7,"body_meaning_value->Body()");
  ppSVar8 = SequenceMeaning::FinalForm(local_1a8);
  FrameProtector::ProtectValue(&local_18,ppSVar8,"body_meaning_value->FinalForm()");
  base_value = (LambdaMeaning *)0x0;
  FrameProtector::ProtectValue(&local_18,(Sexp **)&base_value,"body_meaning");
  base_value = (LambdaMeaning *)GcHeap::AllocateMeaning(&local_1a8->super_Meaning);
  this_00 = (LambdaMeaning *)operator_new(0x20);
  arity = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::size
                    ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)
                     &binding_values.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  LambdaMeaning::LambdaMeaning(this_00,arity,false,(Sexp *)base_value);
  lambda_meaning = (Sexp *)this_00;
  ppSVar8 = LambdaMeaning::Body(this_00);
  FrameProtector::ProtectValue(&local_18,ppSVar8,"base_value->Body()");
  call_meaning = (InvocationMeaning *)0x0;
  FrameProtector::ProtectValue(&local_18,(Sexp **)&call_meaning,"lambda_meaning");
  call_meaning = (InvocationMeaning *)GcHeap::AllocateMeaning((Meaning *)lambda_meaning);
  this_01 = (InvocationMeaning *)operator_new(0x28);
  base = call_meaning;
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
            (&local_200,
             (vector<Sexp_*,_std::allocator<Sexp_*>_> *)
             &body_values.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  InvocationMeaning::InvocationMeaning(this_01,(Sexp *)base,&local_200);
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::~vector(&local_200);
  local_1e8 = this_01;
  ppSVar8 = InvocationMeaning::Base(this_01);
  FrameProtector::ProtectValue(&local_18,ppSVar8,"call_meaning->Base()");
  pvVar7 = InvocationMeaning::Arguments(local_1e8);
  FrameProtector::ProtectVector(&local_18,pvVar7,"call_meaning->Arguments()");
  pSVar5 = GcHeap::AllocateMeaning(&local_1e8->super_Meaning);
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::~vector
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)&len);
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::~vector
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)
             &body_values.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Sexp_*,_std::allocator<Sexp_*>_>::~vector
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)
             &binding_values.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  FrameProtector::~FrameProtector(&local_18);
  return pSVar5;
}

Assistant:

static Sexp *AnalyzeLet(Sexp *form) {
  GC_HELPER_FRAME;
  GC_PROTECT(form);
  GC_PROTECTED_LOCAL(bindings);
  GC_PROTECTED_LOCAL_VECTOR(variables);
  GC_PROTECTED_LOCAL_VECTOR(binding_values);
  GC_PROTECTED_LOCAL_VECTOR(body_values);
  // (let ((var binding) ...) body ...)

  size_t len;
  bool is_proper;
  std::tie(is_proper, len) = form->Length();
  if (!is_proper) {
    throw JetRuntimeException("invalid let form");
  }

  if (!form->Car()->IsCons()) {
    throw JetRuntimeException("invalid let form: bad binding list");
  }

  bindings = form->Car();
  if (!bindings->IsProperList()) {
    throw JetRuntimeException("invalid let form: bad binding list");
  }

  g_the_environment->EnterScope();
  bindings->ForEach([&](Sexp *binding) {
    GC_HELPER_FRAME;
    GC_PROTECT(binding);

    if (!binding->IsCons() || !binding->IsProperList()) {
      throw JetRuntimeException("invalid let form: bad binding list");
    }

    size_t binding_len;
    std::tie(std::ignore, binding_len) = binding->Length();
    if (binding_len != 2) {
      throw JetRuntimeException("invalid let form: bad binding list");
    }

    if (!binding->Car()->IsSymbol()) {
      throw JetRuntimeException("invalid let form: bad variable name");
    }

    variables.push_back(binding->Car());
    g_the_environment->Define(binding->Car()->symbol_value);
  });

  assert(form->Cdr()->IsCons());
  form->Cdr()->ForEach([&](Sexp *body) {
    GC_HELPER_FRAME;
    GC_PROTECT(body);

    body_values.push_back(Analyze(body));
  });

  g_the_environment->ExitScope();

  // once we've exited the scope, we visit binding values.
  bindings->ForEach([&](Sexp *binding) {
    GC_HELPER_FRAME;
    GC_PROTECT(binding);

    binding_values.push_back(Analyze(binding->Cadr()));
  });

  GC_PROTECTED_LOCAL(last);
  last = body_values.back();
  body_values.pop_back();

  SequenceMeaning *body_meaning_value =
      new SequenceMeaning(std::move(body_values), last);
  GC_PROTECT_VECTOR(body_meaning_value->Body());
  GC_PROTECT(body_meaning_value->FinalForm());
  GC_PROTECTED_LOCAL(body_meaning);
  body_meaning = GcHeap::AllocateMeaning(body_meaning_value);
  LambdaMeaning *base_value =
      new LambdaMeaning(variables.size(), false, body_meaning);
  GC_PROTECT(base_value->Body());
  GC_PROTECTED_LOCAL(lambda_meaning);
  lambda_meaning = GcHeap::AllocateMeaning(base_value);
  InvocationMeaning *call_meaning =
      new InvocationMeaning(lambda_meaning, std::move(binding_values));
  GC_PROTECT(call_meaning->Base());
  GC_PROTECT_VECTOR(call_meaning->Arguments());
  return GcHeap::AllocateMeaning(call_meaning);
}